

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ViewportArray::ScissorTestStateAPI::iterate(ScissorTestStateAPI *this)

{
  pointer *this_00;
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_01;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar5;
  TestContext *pTVar6;
  int local_74;
  int local_70;
  GLint i_4;
  GLint i_3;
  GLint i_2;
  GLint i_1;
  GLint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scissor_test_states_b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scissor_test_states_a;
  GLint max_viewports;
  bool test_result;
  Functions *gl;
  ScissorTestStateAPI *this_local;
  long lVar4;
  
  if (((this->super_TestCaseBase).m_is_viewport_array_supported & 1U) == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Viewport array functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x915);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  (**(code **)(lVar4 + 0x868))
            (0x825b,&scissor_test_states_a.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x921);
  this_00 = &scissor_test_states_b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (long)(int)scissor_test_states_a.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
             (long)(int)scissor_test_states_a.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  getScissorTestStates
            (this,(int)scissor_test_states_a.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &scissor_test_states_b.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  for (i_2 = 0; i_2 < (int)scissor_test_states_a.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage; i_2 = i_2 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &scissor_test_states_b.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_2);
    if (*pvVar5 == '\0') {
      (**(code **)(lVar4 + 0x618))(0xc11,i_2);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Enablei",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x939);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &scissor_test_states_b.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)i_2);
      *pvVar5 = '\x01';
    }
    else {
      (**(code **)(lVar4 + 0x520))(0xc11,i_2);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Disablei",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x940);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &scissor_test_states_b.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)i_2);
      *pvVar5 = '\0';
    }
    getScissorTestStates
              (this,(int)scissor_test_states_a.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
    compareScissorTestStates
              (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &scissor_test_states_b.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,"1st toggle",
               (bool *)((long)&scissor_test_states_a.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  for (i_3 = 0; i_3 < (int)scissor_test_states_a.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage; i_3 = i_3 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &scissor_test_states_b.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_3);
    if (*pvVar5 == '\0') {
      (**(code **)(lVar4 + 0x618))(0xc11,i_3);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Enablei",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x94e);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &scissor_test_states_b.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)i_3);
      *pvVar5 = '\x01';
    }
    else {
      (**(code **)(lVar4 + 0x520))(0xc11,i_3);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Disablei",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x955);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &scissor_test_states_b.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)i_3);
      *pvVar5 = '\0';
    }
    getScissorTestStates
              (this,(int)scissor_test_states_a.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
    compareScissorTestStates
              (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &scissor_test_states_b.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,"2nd toggle",
               (bool *)((long)&scissor_test_states_a.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  for (i_4 = 0; i_4 < (int)scissor_test_states_a.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage; i_4 = i_4 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &scissor_test_states_b.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_4);
    *pvVar5 = '\x01';
  }
  (**(code **)(lVar4 + 0x5e0))(0xc11);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Enable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x968);
  getScissorTestStates
            (this,(int)scissor_test_states_a.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  compareScissorTestStates
            (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  &scissor_test_states_b.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,"1st enable all",
             (bool *)((long)&scissor_test_states_a.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  for (local_70 = 0;
      local_70 <
      (int)scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage; local_70 = local_70 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &scissor_test_states_b.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_70);
    *pvVar5 = '\0';
  }
  (**(code **)(lVar4 + 0x4e8))(0xc11);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Disable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x977);
  getScissorTestStates
            (this,(int)scissor_test_states_a.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  compareScissorTestStates
            (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  &scissor_test_states_b.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,"Disable all",
             (bool *)((long)&scissor_test_states_a.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  for (local_74 = 0;
      local_74 <
      (int)scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage; local_74 = local_74 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &scissor_test_states_b.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_74);
    *pvVar5 = '\x01';
  }
  (**(code **)(lVar4 + 0x5e0))(0xc11);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Enable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x986);
  getScissorTestStates
            (this,(int)scissor_test_states_a.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  compareScissorTestStates
            (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  &scissor_test_states_b.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,"2nd enable all",
             (bool *)((long)&scissor_test_states_a.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if ((scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 1) {
    pTVar6 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
    tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar6 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
    tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_FAIL,"Fail");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &scissor_test_states_b.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ScissorTestStateAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLboolean> scissor_test_states_a;
	std::vector<GLboolean> scissor_test_states_b;

	scissor_test_states_a.resize(max_viewports);
	scissor_test_states_b.resize(max_viewports);

	/*
	 *   - get initial state of SCISSOR_TEST for all MAX_VIEWPORTS indices;
	 *   - for each index:
	 *     * toggle SCISSOR_TEST,
	 *     * get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 *   - for each index:
	 *     * toggle SCISSOR_TEST,
	 *     * get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	getScissorTestStates(max_viewports, scissor_test_states_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		if (GL_FALSE == scissor_test_states_a[i])
		{
			gl.enablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");

			scissor_test_states_a[i] = GL_TRUE;
		}
		else
		{
			gl.disablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Disablei");

			scissor_test_states_a[i] = GL_FALSE;
		}

		getScissorTestStates(max_viewports, scissor_test_states_b);
		compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "1st toggle", test_result);
	}

	for (GLint i = 0; i < max_viewports; ++i)
	{
		if (GL_FALSE == scissor_test_states_a[i])
		{
			gl.enablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");

			scissor_test_states_a[i] = GL_TRUE;
		}
		else
		{
			gl.disablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Disablei");

			scissor_test_states_a[i] = GL_FALSE;
		}

		getScissorTestStates(max_viewports, scissor_test_states_b);
		compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "2nd toggle", test_result);
	}

	/*
	 *   - enable SCISSOR_TEST for all indices at once with Enable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_TRUE;
	}

	gl.enable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "1st enable all", test_result);

	/*
	 *   - disable SCISSOR_TEST for all indices at once with Disable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_FALSE;
	}

	gl.disable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "Disable all", test_result);

	/*
	 *   - enable SCISSOR_TEST for all indices at once with Enable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_TRUE;
	}

	gl.enable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "2nd enable all", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}